

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidatePopElement(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  uint uVar1;
  int iVar2;
  xmlRegExecCtxtPtr pxVar3;
  xmlRegExecCtxtPtr exec;
  
  uVar1 = 0xffffffff;
  if (((ctxt != (xmlRelaxNGValidCtxtPtr)0x0) && (elem != (xmlNodePtr)0x0)) &&
     (ctxt->elem != (xmlRegExecCtxtPtr)0x0)) {
    if (ctxt->elemNr < 1) {
      exec = (xmlRegExecCtxtPtr)0x0;
    }
    else {
      uVar1 = ctxt->elemNr - 1;
      ctxt->elemNr = uVar1;
      exec = ctxt->elemTab[uVar1];
      ctxt->elemTab[uVar1] = (xmlRegExecCtxtPtr)0x0;
      if (uVar1 == 0) {
        pxVar3 = (xmlRegExecCtxtPtr)0x0;
      }
      else {
        pxVar3 = ctxt->elemTab[(ulong)uVar1 - 1];
      }
      ctxt->elem = pxVar3;
    }
    iVar2 = xmlRegExecPushString(exec,(xmlChar *)0x0,(void *)0x0);
    if (iVar2 == 0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOELEM,"",(xmlChar *)0x0,0);
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = iVar2 >> 0x1f | 1;
    }
    xmlRegFreeExecCtxt(exec);
  }
  return uVar1;
}

Assistant:

int
xmlRelaxNGValidatePopElement(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlDocPtr doc ATTRIBUTE_UNUSED,
                             xmlNodePtr elem)
{
    int ret;
    xmlRegExecCtxtPtr exec;

    if ((ctxt == NULL) || (ctxt->elem == NULL) || (elem == NULL))
        return (-1);
#ifdef DEBUG_PROGRESSIVE
    xmlGenericError(xmlGenericErrorContext, "PopElem %s\n", elem->name);
#endif
    /*
     * verify that we reached a terminal state of the content model.
     */
    exec = xmlRelaxNGElemPop(ctxt);
    ret = xmlRegExecPushString(exec, NULL, NULL);
    if (ret == 0) {
        /*
         * TODO: get some of the names needed to exit the current state of exec
         */
        VALID_ERR2(XML_RELAXNG_ERR_NOELEM, BAD_CAST "");
        ret = -1;
    } else if (ret < 0) {
        ret = -1;
    } else {
        ret = 1;
    }
    xmlRegFreeExecCtxt(exec);
#ifdef DEBUG_PROGRESSIVE
    if (ret < 0)
        xmlGenericError(xmlGenericErrorContext, "PopElem %s failed\n",
                        elem->name);
#endif
    return (ret);
}